

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLower.cpp
# Opt level: O0

void LowerConstantIntoBlock
               (ExpressionContext *ctx,RegVmLoweredFunction *lowFunction,RegVmLoweredBlock *lowBlock
               ,SmallArray<unsigned_char,_32U> *result,VmValue *value)

{
  SynBase *location;
  SmallArray<unsigned_char,_32U> *this;
  RegVmLoweredFunction *ctx_00;
  bool bVar1;
  uchar rA;
  uchar local_59;
  uint local_58;
  uint uStack_54;
  uchar targetReg_4;
  uint i;
  uint constantIndex_3;
  uint constantIndex_2;
  uchar targetReg_3;
  uint constantIndex_1;
  uchar local_3a;
  uchar targetReg_2;
  uint constantIndex;
  uchar targetReg_1;
  uchar targetReg;
  VmConstant *constant;
  VmValue *value_local;
  SmallArray<unsigned_char,_32U> *result_local;
  RegVmLoweredBlock *lowBlock_local;
  RegVmLoweredFunction *lowFunction_local;
  ExpressionContext *ctx_local;
  
  constant = (VmConstant *)value;
  value_local = (VmValue *)result;
  result_local = (SmallArray<unsigned_char,_32U> *)lowBlock;
  lowBlock_local = (RegVmLoweredBlock *)lowFunction;
  lowFunction_local = (RegVmLoweredFunction *)ctx;
  _constantIndex = getType<VmConstant>(value);
  if (_constantIndex == (VmConstant *)0x0) {
    __assert_fail("constant",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLower.cpp"
                  ,0x138,
                  "void LowerConstantIntoBlock(ExpressionContext &, RegVmLoweredFunction *, RegVmLoweredBlock *, SmallArray<unsigned char, 32> &, VmValue *)"
                 );
  }
  bVar1 = VmType::operator==(&(_constantIndex->super_VmValue).type,&VmType::Int);
  if (bVar1) {
    targetReg_2 = RegVmLoweredFunction::GetRegisterForConstant
                            ((RegVmLoweredFunction *)lowBlock_local);
    RegVmLoweredBlock::AddInstruction
              ((RegVmLoweredBlock *)result_local,(ExpressionContext *)lowFunction_local,
               (_constantIndex->super_VmValue).source,rviLoadImm,targetReg_2,'\0','\0',
               _constantIndex->iValue);
    SmallArray<unsigned_char,_32U>::push_back
              ((SmallArray<unsigned_char,_32U> *)value_local,&targetReg_2);
  }
  else {
    bVar1 = VmType::operator==(&(_constantIndex->super_VmValue).type,&VmType::Double);
    if (bVar1) {
      local_3a = RegVmLoweredFunction::GetRegisterForConstant
                           ((RegVmLoweredFunction *)lowBlock_local);
      constantIndex_1 =
           TryLowerConstantToMemory
                     ((RegVmLoweredBlock *)result_local,&_constantIndex->super_VmValue);
      if (constantIndex_1 == 0) {
        __assert_fail("constantIndex",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLower.cpp"
                      ,0x148,
                      "void LowerConstantIntoBlock(ExpressionContext &, RegVmLoweredFunction *, RegVmLoweredBlock *, SmallArray<unsigned char, 32> &, VmValue *)"
                     );
      }
      RegVmLoweredBlock::AddInstruction
                ((RegVmLoweredBlock *)result_local,(ExpressionContext *)lowFunction_local,
                 (_constantIndex->super_VmValue).source,rviLoadDouble,local_3a,'\0','\x02',
                 (constantIndex_1 - 1) * 4);
      SmallArray<unsigned_char,_32U>::push_back
                ((SmallArray<unsigned_char,_32U> *)value_local,&local_3a);
    }
    else {
      bVar1 = VmType::operator==(&(_constantIndex->super_VmValue).type,&VmType::Long);
      if (bVar1) {
        targetReg_3 = RegVmLoweredFunction::GetRegisterForConstant
                                ((RegVmLoweredFunction *)lowBlock_local);
        constantIndex_2 =
             TryLowerConstantToMemory
                       ((RegVmLoweredBlock *)result_local,&_constantIndex->super_VmValue);
        if (constantIndex_2 == 0) {
          __assert_fail("constantIndex",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLower.cpp"
                        ,0x154,
                        "void LowerConstantIntoBlock(ExpressionContext &, RegVmLoweredFunction *, RegVmLoweredBlock *, SmallArray<unsigned char, 32> &, VmValue *)"
                       );
        }
        RegVmLoweredBlock::AddInstruction
                  ((RegVmLoweredBlock *)result_local,(ExpressionContext *)lowFunction_local,
                   (_constantIndex->super_VmValue).source,rviLoadLong,targetReg_3,'\0','\x02',
                   (constantIndex_2 - 1) * 4);
        SmallArray<unsigned_char,_32U>::push_back
                  ((SmallArray<unsigned_char,_32U> *)value_local,&targetReg_3);
      }
      else if ((_constantIndex->super_VmValue).type.type == VM_TYPE_POINTER) {
        rA = RegVmLoweredFunction::GetRegisterForConstant((RegVmLoweredFunction *)lowBlock_local);
        ctx_00 = lowFunction_local;
        this = result_local;
        constantIndex_3._3_1_ = rA;
        if (_constantIndex->container == (VariableData *)0x0) {
          if (_constantIndex->iValue != 0) {
            __assert_fail("constant->iValue == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLower.cpp"
                          ,0x160,
                          "void LowerConstantIntoBlock(ExpressionContext &, RegVmLoweredFunction *, RegVmLoweredBlock *, SmallArray<unsigned char, 32> &, VmValue *)"
                         );
          }
          i = TryLowerConstantToMemory
                        ((RegVmLoweredBlock *)result_local,&_constantIndex->super_VmValue);
          if (i == 0) {
            __assert_fail("constantIndex",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLower.cpp"
                          ,0x166,
                          "void LowerConstantIntoBlock(ExpressionContext &, RegVmLoweredFunction *, RegVmLoweredBlock *, SmallArray<unsigned char, 32> &, VmValue *)"
                         );
          }
          RegVmLoweredBlock::AddInstruction
                    ((RegVmLoweredBlock *)result_local,(ExpressionContext *)lowFunction_local,
                     (_constantIndex->super_VmValue).source,rviLoadLong,constantIndex_3._3_1_,'\0',
                     '\x02',(i - 1) * 4);
        }
        else {
          location = (_constantIndex->super_VmValue).source;
          bVar1 = IsLocalScope(_constantIndex->container->scope);
          RegVmLoweredBlock::AddInstruction
                    ((RegVmLoweredBlock *)this,(ExpressionContext *)ctx_00,location,rviGetAddr,rA,
                     '\0',bVar1,_constantIndex);
        }
        SmallArray<unsigned_char,_32U>::push_back
                  ((SmallArray<unsigned_char,_32U> *)value_local,
                   (uchar *)((long)&constantIndex_3 + 3));
      }
      else {
        if ((_constantIndex->super_VmValue).type.type != VM_TYPE_STRUCT) {
          __assert_fail("!\"unknown type\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLower.cpp"
                        ,0x18b,
                        "void LowerConstantIntoBlock(ExpressionContext &, RegVmLoweredFunction *, RegVmLoweredBlock *, SmallArray<unsigned char, 32> &, VmValue *)"
                       );
        }
        if (((_constantIndex->super_VmValue).type.size & 3) != 0) {
          __assert_fail("constant->type.size % 4 == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLower.cpp"
                        ,0x178,
                        "void LowerConstantIntoBlock(ExpressionContext &, RegVmLoweredFunction *, RegVmLoweredBlock *, SmallArray<unsigned char, 32> &, VmValue *)"
                       );
        }
        uStack_54 = TryLowerConstantToMemory
                              ((RegVmLoweredBlock *)result_local,&_constantIndex->super_VmValue);
        if (uStack_54 == 0) {
          __assert_fail("constantIndex",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLower.cpp"
                        ,0x17c,
                        "void LowerConstantIntoBlock(ExpressionContext &, RegVmLoweredFunction *, RegVmLoweredBlock *, SmallArray<unsigned char, 32> &, VmValue *)"
                       );
        }
        for (local_58 = 0; local_58 < (_constantIndex->super_VmValue).type.size >> 2;
            local_58 = local_58 + 2) {
          local_59 = RegVmLoweredFunction::GetRegisterForConstant
                               ((RegVmLoweredFunction *)lowBlock_local);
          SmallArray<unsigned_char,_32U>::push_back
                    ((SmallArray<unsigned_char,_32U> *)value_local,&local_59);
          if (((_constantIndex->super_VmValue).type.size >> 2) - local_58 < 2) {
            RegVmLoweredBlock::AddInstruction
                      ((RegVmLoweredBlock *)result_local,(ExpressionContext *)lowFunction_local,
                       (_constantIndex->super_VmValue).source,rviLoadDword,local_59,'\0','\x02',
                       ((uStack_54 - 1) + local_58) * 4);
          }
          else {
            RegVmLoweredBlock::AddInstruction
                      ((RegVmLoweredBlock *)result_local,(ExpressionContext *)lowFunction_local,
                       (_constantIndex->super_VmValue).source,rviLoadLong,local_59,'\0','\x02',
                       ((uStack_54 - 1) + local_58) * 4);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void LowerConstantIntoBlock(ExpressionContext &ctx, RegVmLoweredFunction *lowFunction, RegVmLoweredBlock *lowBlock, SmallArray<unsigned char, 32> &result, VmValue *value)
{
	VmConstant *constant = getType<VmConstant>(value);

	assert(constant);

	if(constant->type == VmType::Int)
	{
		unsigned char targetReg = lowFunction->GetRegisterForConstant();

		lowBlock->AddInstruction(ctx, constant->source, rviLoadImm, targetReg, 0, 0, constant->iValue);

		result.push_back(targetReg);
	}
	else if(constant->type == VmType::Double)
	{
		unsigned char targetReg = lowFunction->GetRegisterForConstant();

		unsigned constantIndex = TryLowerConstantToMemory(lowBlock, constant);

		assert(constantIndex);

		lowBlock->AddInstruction(ctx, constant->source, rviLoadDouble, targetReg, 0, rvrrConstants, (constantIndex - 1) * sizeof(unsigned));

		result.push_back(targetReg);
	}
	else if(constant->type == VmType::Long)
	{
		unsigned char targetReg = lowFunction->GetRegisterForConstant();

		unsigned constantIndex = TryLowerConstantToMemory(lowBlock, constant);

		assert(constantIndex);

		lowBlock->AddInstruction(ctx, constant->source, rviLoadLong, targetReg, 0, rvrrConstants, (constantIndex - 1) * sizeof(unsigned));

		result.push_back(targetReg);
	}
	else if(constant->type.type == VM_TYPE_POINTER)
	{
		unsigned char targetReg = lowFunction->GetRegisterForConstant();

		if(!constant->container)
		{
			assert(constant->iValue == 0);

			if(NULLC_PTR_SIZE == 8)
			{
				unsigned constantIndex = TryLowerConstantToMemory(lowBlock, constant);

				assert(constantIndex);

				lowBlock->AddInstruction(ctx, constant->source, rviLoadLong, targetReg, 0, rvrrConstants, (constantIndex - 1) * sizeof(unsigned));
			}
			else
			{
				lowBlock->AddInstruction(ctx, constant->source, rviLoadImm, targetReg, 0, 0, 0u);
			}
		}
		else
		{
			lowBlock->AddInstruction(ctx, constant->source, rviGetAddr, targetReg, 0, IsLocalScope(constant->container->scope) ? rvrrFrame : rvrrGlobals, constant);
		}

		result.push_back(targetReg);
	}
	else if(constant->type.type == VM_TYPE_STRUCT)
	{
		assert(constant->type.size % 4 == 0);

		unsigned constantIndex = TryLowerConstantToMemory(lowBlock, constant);

		assert(constantIndex);

		for(unsigned i = 0; i < constant->type.size / 4; i += 2)
		{
			unsigned char targetReg = lowFunction->GetRegisterForConstant();
			result.push_back(targetReg);

			if(constant->type.size / 4 - i >= 2)
				lowBlock->AddInstruction(ctx, constant->source, rviLoadLong, targetReg, 0, rvrrConstants, (constantIndex - 1 + i) * sizeof(unsigned));
			else
				lowBlock->AddInstruction(ctx, constant->source, rviLoadDword, targetReg, 0, rvrrConstants, (constantIndex - 1 + i) * sizeof(unsigned));
		}
	}
	else
	{
		assert(!"unknown type");
	}
}